

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_tabletype_t::wasm_tabletype_t
          (wasm_tabletype_t *this,wasm_valtype_t *type,wasm_limits_t *limits)

{
  Limits local_48;
  Type local_30;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_28;
  wasm_limits_t *local_20;
  wasm_limits_t *limits_local;
  wasm_valtype_t *type_local;
  wasm_tabletype_t *this_local;
  
  local_20 = limits;
  limits_local = (wasm_limits_t *)type;
  type_local = (wasm_valtype_t *)this;
  ToWabtLimits(&local_48,limits);
  std::make_unique<wabt::interp::TableType,wabt::Type&,wabt::Limits>(&local_30,(Limits *)type);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::TableType,std::default_delete<wabt::interp::TableType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             &local_28,
             (unique_ptr<wabt::interp::TableType,_std::default_delete<wabt::interp::TableType>_> *)
             &local_30);
  wasm_externtype_t::wasm_externtype_t(&this->super_wasm_externtype_t,&local_28);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_28);
  std::unique_ptr<wabt::interp::TableType,_std::default_delete<wabt::interp::TableType>_>::
  ~unique_ptr((unique_ptr<wabt::interp::TableType,_std::default_delete<wabt::interp::TableType>_> *)
              &local_30);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_tabletype_t_0043ec70;
  (this->elemtype).I = *(ValueType *)limits_local;
  this->limits = *local_20;
  wasm_valtype_delete((wasm_valtype_t *)limits_local);
  return;
}

Assistant:

wasm_tabletype_t(own wasm_valtype_t* type, const wasm_limits_t* limits)
      : wasm_externtype_t{std::make_unique<TableType>(type->I,
                                                      ToWabtLimits(*limits))},
        elemtype(*type),
        limits(*limits) {
    wasm_valtype_delete(type);
  }